

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_containers.h
# Opt level: O3

void basisu::vector<basist::ktx2_etc1s_image_desc>::object_mover
               (void *pDst_void,void *pSrc_void,uint32_t num)

{
  undefined4 *puVar1;
  long lVar2;
  ktx2_etc1s_image_desc *pSrc;
  
  if (num != 0) {
    lVar2 = 0;
    do {
      puVar1 = (undefined4 *)((long)pSrc_void + lVar2);
      *(undefined4 *)((long)pDst_void + lVar2) = *puVar1;
      *(undefined4 *)((long)pDst_void + lVar2 + 4) = puVar1[1];
      *(undefined4 *)((long)pDst_void + lVar2 + 8) = puVar1[2];
      *(undefined4 *)((long)pDst_void + lVar2 + 0xc) = puVar1[3];
      *(undefined4 *)((long)pDst_void + lVar2 + 0x10) = puVar1[4];
      lVar2 = lVar2 + 0x14;
    } while (puVar1 + 5 != (undefined4 *)((long)pSrc_void + (ulong)num * 0x14));
  }
  return;
}

Assistant:

static void object_mover(void* pDst_void, void* pSrc_void, uint32_t num)
      {
         T* pSrc = static_cast<T*>(pSrc_void);
         T* const pSrc_end = pSrc + num;
         T* pDst = static_cast<T*>(pDst_void);

         while (pSrc != pSrc_end)
         {
            // placement new
            new (static_cast<void*>(pDst)) T(*pSrc);
            pSrc->~T();
            ++pSrc;
            ++pDst;
         }
      }